

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NtkTransferOrder(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew)

{
  int iVar1;
  Abc_Nam_t *p;
  Abc_Nam_t *p_00;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  
  p = Abc_NtkNameMan(pNtkOld,0);
  p_00 = Abc_NtkNameMan(pNtkOld,1);
  if (pNtkOld->vPis->nSize != pNtkNew->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtkOld) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                  ,0x19e,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->vPos->nSize != pNtkNew->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                  ,0x19f,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->nObjCounts[8] != pNtkNew->nObjCounts[8]) {
    __assert_fail("Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                  ,0x1a0,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar5 = pNtkNew->vCis->nSize;
  iVar4 = 0;
  do {
    if (iVar5 <= iVar4) {
      iVar5 = pNtkNew->vCos->nSize;
      iVar4 = 0;
      goto LAB_0067d314;
    }
    pAVar2 = Abc_NtkCi(pNtkNew,iVar4);
    pcVar3 = Abc_ObjName(pAVar2);
    iVar1 = Abc_NamStrFind(p,pcVar3);
    (pAVar2->field_6).iTemp = iVar1;
    if (iVar1 < 1) break;
    iVar5 = pNtkNew->vCis->nSize;
    iVar4 = iVar4 + 1;
  } while (iVar1 <= iVar5);
  __assert_fail("pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCiNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                ,0x1a5,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
  while( true ) {
    iVar5 = pNtkNew->vCos->nSize;
    iVar4 = iVar4 + 1;
    if (iVar5 < iVar1) break;
LAB_0067d314:
    if (iVar5 <= iVar4) {
      Abc_NamDeref(p);
      Abc_NamDeref(p_00);
      qsort(pNtkNew->vPis->pArray,(long)pNtkNew->vPis->nSize,8,Abc_NodeCompareIndexes);
      qsort(pNtkNew->vPos->pArray,(long)pNtkNew->vPos->nSize,8,Abc_NodeCompareIndexes);
      qsort(pNtkNew->vCis->pArray,(long)pNtkNew->vCis->nSize,8,Abc_NodeCompareIndexes);
      qsort(pNtkNew->vCos->pArray,(long)pNtkNew->vCos->nSize,8,Abc_NodeCompareIndexes);
      for (iVar5 = 0; iVar5 < pNtkNew->vCis->nSize; iVar5 = iVar5 + 1) {
        pAVar2 = Abc_NtkCi(pNtkNew,iVar5);
        (pAVar2->field_6).iTemp = 0;
      }
      for (iVar5 = 0; iVar5 < pNtkNew->vCos->nSize; iVar5 = iVar5 + 1) {
        pAVar2 = Abc_NtkCo(pNtkNew,iVar5);
        (pAVar2->field_6).iTemp = 0;
      }
      return;
    }
    pAVar2 = Abc_NtkCo(pNtkNew,iVar4);
    pcVar3 = Abc_ObjName(pAVar2);
    iVar1 = Abc_NamStrFind(p_00,pcVar3);
    (pAVar2->field_6).iTemp = iVar1;
    if (iVar1 < 1) break;
  }
  __assert_fail("pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCoNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNames.c"
                ,0x1aa,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkTransferOrder( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj;  int i;
    Abc_Nam_t * pStrsCi = Abc_NtkNameMan( pNtkOld, 0 );
    Abc_Nam_t * pStrsCo = Abc_NtkNameMan( pNtkOld, 1 );
    assert( Abc_NtkPiNum(pNtkOld) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew) );
    // transfer to the new network
    Abc_NtkForEachCi( pNtkNew, pObj, i )
    {
        pObj->iTemp = Abc_NamStrFind(pStrsCi, Abc_ObjName(pObj));
        assert( pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCiNum(pNtkNew) );
    }
    Abc_NtkForEachCo( pNtkNew, pObj, i )
    {
        pObj->iTemp = Abc_NamStrFind(pStrsCo, Abc_ObjName(pObj));
        assert( pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCoNum(pNtkNew) );
    }
    Abc_NamDeref( pStrsCi );
    Abc_NamDeref( pStrsCo );
    // order PI/PO 
    qsort( (void *)Vec_PtrArray(pNtkNew->vPis), (size_t)Vec_PtrSize(pNtkNew->vPis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    qsort( (void *)Vec_PtrArray(pNtkNew->vPos), (size_t)Vec_PtrSize(pNtkNew->vPos), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    // order CI/CO 
    qsort( (void *)Vec_PtrArray(pNtkNew->vCis), (size_t)Vec_PtrSize(pNtkNew->vCis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    qsort( (void *)Vec_PtrArray(pNtkNew->vCos), (size_t)Vec_PtrSize(pNtkNew->vCos), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    // order CIs/COs first PIs/POs(Asserts) then latches
    //Abc_NtkOrderCisCos( pNtk );
    // clean the copy fields
    Abc_NtkForEachCi( pNtkNew, pObj, i )
        pObj->iTemp = 0;
    Abc_NtkForEachCo( pNtkNew, pObj, i )
        pObj->iTemp = 0;
}